

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

ostream * std::operator<<(ostream *ofs,Extent v)

{
  undefined1 in_stack_00000160 [24];
  long *local_30;
  long local_28;
  long local_20 [2];
  
  tinyusdz::to_string_abi_cxx11_((Extent)in_stack_00000160);
  std::__ostream_insert<char,std::char_traits<char>>(ofs,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Extent v) {
  ofs << to_string(v);

  return ofs;
}